

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,size_type sizeLimit)

{
  size_type sVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x26a833);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    cVar2 = std::ios::widen((char)*(long *)(*(long *)is + -0x18) + (char)is);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)line,cVar2);
    sVar1 = line->_M_string_length;
    bVar3 = true;
    if (sVar1 == 0) {
      bVar3 = ((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0;
    }
    else {
      if ((line->_M_dataplus)._M_p[sVar1 - 1] == '\r') {
        std::__cxx11::string::resize((ulong)line,(char)sVar1 + -1);
      }
      if ((sizeLimit != 0xffffffffffffffff) && (sizeLimit < line->_M_string_length)) {
        std::__cxx11::string::resize((ulong)line,(char)sizeLimit);
      }
    }
    if (has_newline == (bool *)0x0) {
      return bVar3;
    }
    bVar4 = ((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0;
  }
  else {
    bVar4 = false;
    bVar3 = false;
    if (has_newline == (bool *)0x0) {
      return false;
    }
  }
  *has_newline = bVar4;
  return bVar3;
}

Assistant:

bool SystemTools::GetLineFromStream(
  std::istream& is, std::string& line, bool* has_newline /* = 0 */,
  std::string::size_type sizeLimit /* = std::string::npos */)
{
  // Start with an empty line.
  line = "";

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if (!is) {
    if (has_newline) {
      *has_newline = false;
    }
    return false;
  }

  std::getline(is, line);
  bool haveData = !line.empty() || !is.eof();
  if (!line.empty()) {
    // Avoid storing a carriage return character.
    if (line.back() == '\r') {
      line.resize(line.size() - 1);
    }

    // if we read too much then truncate the buffer
    if (sizeLimit != std::string::npos && line.size() > sizeLimit) {
      line.resize(sizeLimit);
    }
  }

  // Return the results.
  if (has_newline) {
    *has_newline = !is.eof();
  }
  return haveData;
}